

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O0

void __thiscall
nuraft::inmem_log_store::write_at(inmem_log_store *this,ulong index,ptr<log_entry> *entry)

{
  bool bVar1;
  iterator __k;
  __int_type_conflict _Var2;
  EventAwaiter *this_00;
  mapped_type *pmVar3;
  pointer ppVar4;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *in_RSI;
  map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
  *in_RDI;
  iterator entry_1;
  uint64_t cur_time;
  iterator itr;
  lock_guard<std::mutex> l;
  ptr<log_entry> clone;
  iterator in_stack_ffffffffffffff18;
  map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
  *in_stack_ffffffffffffff20;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *this_01;
  iterator in_stack_ffffffffffffff28;
  iterator __position;
  ptr<log_entry> *in_stack_ffffffffffffff78;
  _Self local_80;
  _Self local_78;
  long local_70;
  EventAwaiter *local_68;
  _Base_ptr local_60;
  _Base_ptr local_58;
  _Self local_50;
  _Self local_48 [7];
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *local_10;
  
  local_10 = in_RSI;
  make_clone(in_stack_ffffffffffffff78);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff20,
             (mutex_type *)in_stack_ffffffffffffff18._M_node);
  __k = std::
        map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
        ::lower_bound(in_stack_ffffffffffffff18._M_node,(key_type *)0x22aa6f);
  local_48[0]._M_node = __k._M_node;
  while( true ) {
    local_50._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
         ::end(in_stack_ffffffffffffff18._M_node);
    bVar1 = std::operator!=(local_48,&local_50);
    if (!bVar1) break;
    local_60 = local_48[0]._M_node;
    local_58 = (_Base_ptr)
               std::
               map<unsigned_long,std::shared_ptr<nuraft::log_entry>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<nuraft::log_entry>>>>
               ::erase_abi_cxx11_(in_stack_ffffffffffffff20,in_stack_ffffffffffffff28);
    local_48[0]._M_node = local_58;
  }
  std::
  map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
  ::operator[](in_RDI,(key_type *)__k._M_node);
  std::shared_ptr<nuraft::log_entry>::operator=
            ((shared_ptr<nuraft::log_entry> *)in_stack_ffffffffffffff20,
             (shared_ptr<nuraft::log_entry> *)in_stack_ffffffffffffff18._M_node);
  _Var2 = std::__atomic_base::operator_cast_to_unsigned_long
                    ((__atomic_base<unsigned_long> *)in_stack_ffffffffffffff28._M_node);
  if (_Var2 != 0) {
    this_00 = (EventAwaiter *)timer_helper::get_timeofday_us();
    __position._M_node = (_Base_ptr)&in_RDI[2]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    this_01 = local_10;
    local_68 = this_00;
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_long
                      ((__atomic_base<unsigned_long> *)__position._M_node);
    local_70 = (long)this_00 + _Var2 * 1000;
    pmVar3 = std::
             map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::operator[]((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                           *)in_RDI,(key_type *)__k._M_node);
    *pmVar3 = (mapped_type)this_01;
    local_78._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
         ::begin(in_stack_ffffffffffffff18._M_node);
    while( true ) {
      local_80._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ::end(in_stack_ffffffffffffff18._M_node);
      bVar1 = std::operator!=(&local_78,&local_80);
      if (!bVar1) break;
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_> *)
                          0x22ac55);
      if (local_10 <
          (map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           *)ppVar4->second) {
        in_stack_ffffffffffffff18 =
             std::
             map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
             ::erase_abi_cxx11_(this_01,__position);
        local_78._M_node = in_stack_ffffffffffffff18._M_node;
      }
      else {
        std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator++
                  ((_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_> *)
                   __position._M_node,(int)((ulong)this_01 >> 0x20));
      }
    }
    EventAwaiter::invoke(this_00);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x22acd3);
  std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x22ace0);
  return;
}

Assistant:

void inmem_log_store::write_at(ulong index, ptr<log_entry>& entry) {
    ptr<log_entry> clone = make_clone(entry);

    // Discard all logs equal to or greater than `index.
    std::lock_guard<std::mutex> l(logs_lock_);
    auto itr = logs_.lower_bound(index);
    while (itr != logs_.end()) {
        itr = logs_.erase(itr);
    }
    logs_[index] = clone;

    if (disk_emul_delay) {
        uint64_t cur_time = timer_helper::get_timeofday_us();
        disk_emul_logs_being_written_[cur_time + disk_emul_delay * 1000] = index;

        // Remove entries greater than `index`.
        auto entry = disk_emul_logs_being_written_.begin();
        while (entry != disk_emul_logs_being_written_.end()) {
            if (entry->second > index) {
                entry = disk_emul_logs_being_written_.erase(entry);
            } else {
                entry++;
            }
        }
        disk_emul_ea_.invoke();
    }
}